

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::FBXConverter
          (FBXConverter *this,aiScene *out,Document *doc,bool removeEmptyBones)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  Object *pOVar3;
  Material *material;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  
  this->defaultMaterialIndex = 0;
  p_Var1 = &(this->materials_converted)._M_t._M_impl.super__Rb_tree_header;
  memset(&this->meshes,0,0xa8);
  (this->materials_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->materials_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var2 = &(this->textures_converted)._M_t._M_impl.super__Rb_tree_header;
  (this->materials_converted)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->textures_converted)._M_t._M_impl = 0;
  *(undefined8 *)&(this->textures_converted)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->textures_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->textures_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->textures_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  p_Var2 = &(this->meshes_converted)._M_t._M_impl.super__Rb_tree_header;
  (this->textures_converted)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->meshes_converted)._M_t._M_impl = 0;
  *(undefined8 *)&(this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header
  ;
  (this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  p_Var2 = &(this->node_anim_chain_bits)._M_t._M_impl.super__Rb_tree_header;
  (this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->node_anim_chain_bits)._M_t._M_impl = 0;
  *(undefined8 *)&(this->node_anim_chain_bits)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->node_anim_chain_bits)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->node_anim_chain_bits)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->node_anim_chain_bits)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->node_anim_chain_bits)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mNodeNames)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->mNodeNames)._M_h._M_bucket_count = 0;
  (this->mNodeNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mNodeNames)._M_h._M_element_count = 0;
  *(undefined8 *)&(this->mNodeNames)._M_h._M_rehash_policy = 0;
  (this->mNodeNames)._M_h._M_buckets = &(this->mNodeNames)._M_h._M_single_bucket;
  (this->mNodeNames)._M_h._M_bucket_count = 1;
  (this->mNodeNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mNodeNames)._M_h._M_element_count = 0;
  (this->mNodeNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mNodeNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mNodeNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->anim_fps = 0.0;
  this->out = out;
  this->doc = doc;
  ConvertAnimations(this);
  ConvertRootNode(this);
  if (doc->settings->readAllMaterials == true) {
    for (p_Var4 = (doc->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(doc->objects)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      pOVar3 = LazyObject::Get((LazyObject *)p_Var4[1]._M_parent,false);
      if ((pOVar3 != (Object *)0x0) &&
         (material = (Material *)__dynamic_cast(pOVar3,&Object::typeinfo,&Material::typeinfo,0),
         material != (Material *)0x0)) {
        p_Var5 = (this->materials_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var6 = &p_Var1->_M_header;
        if (p_Var5 != (_Base_ptr)0x0) {
          do {
            if (*(Material **)(p_Var5 + 1) >= material) {
              p_Var6 = p_Var5;
            }
            p_Var5 = (&p_Var5->_M_left)[*(Material **)(p_Var5 + 1) < material];
          } while (p_Var5 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
             ((Material *)((_Rb_tree_header *)p_Var6)->_M_node_count <= material))
          goto LAB_0016b171;
        }
        ConvertMaterial(this,material,(MeshGeometry *)0x0);
      }
LAB_0016b171:
    }
  }
  ConvertGlobalSettings(this);
  TransferDataToScene(this);
  if (out->mNumMeshes == 0) {
    *(byte *)&out->mFlags = (byte)out->mFlags | 1;
  }
  return;
}

Assistant:

FBXConverter::FBXConverter(aiScene* out, const Document& doc, bool removeEmptyBones )
        : defaultMaterialIndex()
        , lights()
        , cameras()
        , textures()
        , materials_converted()
        , textures_converted()
        , meshes_converted()
        , node_anim_chain_bits()
        , mNodeNames()
        , anim_fps()
        , out(out)
        , doc(doc) {
            // animations need to be converted first since this will
            // populate the node_anim_chain_bits map, which is needed
            // to determine which nodes need to be generated.
            ConvertAnimations();
            ConvertRootNode();

            if (doc.Settings().readAllMaterials) {
                // unfortunately this means we have to evaluate all objects
                for (const ObjectMap::value_type& v : doc.Objects()) {

                    const Object* ob = v.second->Get();
                    if (!ob) {
                        continue;
                    }

                    const Material* mat = dynamic_cast<const Material*>(ob);
                    if (mat) {

                        if (materials_converted.find(mat) == materials_converted.end()) {
                            ConvertMaterial(*mat, 0);
                        }
                    }
                }
            }

            ConvertGlobalSettings();
            TransferDataToScene();

            // if we didn't read any meshes set the AI_SCENE_FLAGS_INCOMPLETE
            // to make sure the scene passes assimp's validation. FBX files
            // need not contain geometry (i.e. camera animations, raw armatures).
            if (out->mNumMeshes == 0) {
                out->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
            }
        }